

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# branch_and_reduce_algorithm.cpp
# Opt level: O1

bool __thiscall branch_and_reduce_algorithm::lpReduction(branch_and_reduce_algorithm *this)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  pointer piVar5;
  pointer piVar6;
  pointer piVar7;
  pointer pvVar8;
  pointer piVar9;
  pointer piVar10;
  pointer piVar11;
  pointer piVar12;
  int *piVar13;
  bool bVar14;
  ulong uVar15;
  ulong uVar16;
  int *piVar17;
  uint uVar18;
  int iVar19;
  long lVar20;
  long lVar21;
  uint local_5c;
  value_type_conflict1 local_34;
  
  iVar1 = this->rn;
  updateLP(this);
  uVar15 = (ulong)(uint)this->n;
  if (0 < this->n) {
    lVar21 = 0;
    do {
      if ((this->x).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_start[lVar21] < 0) {
        piVar5 = (this->used).used.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start;
        iVar19 = (this->used).uid;
        if ((piVar5[lVar21] == iVar19) && (piVar5[(int)uVar15 + (int)lVar21] != iVar19)) {
          set(this,(int)lVar21,0);
        }
      }
      lVar21 = lVar21 + 1;
      uVar15 = (ulong)this->n;
    } while (lVar21 < (long)uVar15);
  }
  iVar19 = (this->used).uid;
  (this->used).uid = iVar19 + 1;
  if (iVar19 < -1) {
    piVar5 = (this->used).used.super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    lVar21 = (long)(this->used).used.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_finish - (long)piVar5;
    if (lVar21 != 0) {
      uVar15 = 0;
      do {
        piVar5[uVar15] = 0;
        uVar15 = uVar15 + 1;
      } while ((uVar15 & 0xffffffff) < (ulong)(lVar21 >> 2));
    }
    (this->used).uid = 1;
  }
  local_34 = 0;
  std::vector<int,_std::allocator<int>_>::_M_fill_assign
            (&this->iter,
             (long)(this->iter).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_finish -
             (long)(this->iter).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_start >> 2,&local_34);
  if (this->n < 1) {
    local_5c = 0;
  }
  else {
    piVar5 = (this->x).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
             ._M_start;
    piVar6 = (this->que).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    piVar7 = (this->used).used.super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    lVar21 = 0;
    local_5c = 0;
    do {
      if ((piVar5[lVar21] < 0) &&
         (iVar19 = (this->used).uid, iVar2 = piVar7[lVar21], piVar7[lVar21] = iVar19,
         iVar2 != iVar19)) {
        *piVar6 = (int)lVar21;
        pvVar8 = (this->adj).
                 super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        piVar9 = (this->in).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start;
        piVar10 = (this->iter).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_start;
        piVar11 = (this->level).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_start;
        uVar15 = 0;
        do {
          iVar19 = piVar6[uVar15];
          if (iVar19 < this->n) {
            lVar20 = *(long *)&pvVar8[iVar19].super__Vector_base<int,_std::allocator<int>_>._M_impl.
                               super__Vector_impl_data;
            piVar12 = *(pointer *)
                       ((long)&pvVar8[iVar19].super__Vector_base<int,_std::allocator<int>_>._M_impl.
                               super__Vector_impl_data + 8);
            do {
              iVar2 = piVar10[iVar19];
              if ((int)((ulong)((long)piVar12 - lVar20) >> 2) <= iVar2) {
                uVar16 = 0xffffffff;
                break;
              }
              iVar3 = this->n;
              piVar10[iVar19] = iVar2 + 1;
              uVar16 = (long)*(int *)(lVar20 + (long)iVar2 * 4) + (long)iVar3;
            } while ((-1 < piVar5[(long)(int)uVar16 - (long)this->n]) ||
                    (iVar2 = (this->used).uid, iVar3 = piVar7[uVar16], piVar7[uVar16] = iVar2,
                    iVar3 == iVar2));
          }
          else {
            iVar2 = piVar9[iVar19 - this->n];
            iVar3 = (this->used).uid;
            uVar16 = 0xffffffff;
            iVar4 = piVar7[iVar2];
            piVar7[iVar2] = iVar3;
            if (iVar4 != iVar3) {
              uVar16 = (ulong)(uint)piVar9[(long)iVar19 - (long)this->n];
            }
          }
          if ((int)uVar16 < 0) {
            lVar20 = (long)(int)local_5c;
            local_5c = local_5c + 1;
            piVar11[lVar20] = iVar19;
            uVar18 = (int)uVar15 - 1;
          }
          else {
            uVar18 = (int)uVar15 + 1;
            piVar6[uVar15 + 1] = (int)uVar16;
          }
          uVar15 = (ulong)uVar18;
        } while (-1 < (int)uVar18);
      }
      lVar21 = lVar21 + 1;
    } while (lVar21 < this->n);
  }
  iVar19 = (this->used).uid;
  (this->used).uid = iVar19 + 1;
  if (iVar19 < -1) {
    piVar5 = (this->used).used.super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    lVar21 = (long)(this->used).used.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_finish - (long)piVar5;
    if (lVar21 != 0) {
      uVar15 = 0;
      do {
        piVar5[uVar15] = 0;
        uVar15 = uVar15 + 1;
      } while ((uVar15 & 0xffffffff) < (ulong)(lVar21 >> 2));
    }
    (this->used).uid = 1;
  }
  if (0 < (int)local_5c) {
    piVar5 = (this->que).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    piVar6 = (this->level).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    piVar7 = (this->used).used.super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    uVar15 = (ulong)local_5c;
    do {
      iVar19 = piVar6[uVar15 - 1];
      iVar2 = (this->used).uid;
      iVar3 = piVar7[iVar19];
      piVar7[iVar19] = iVar2;
      if (iVar3 != iVar2) {
        *piVar5 = piVar6[uVar15 - 1];
        pvVar8 = (this->adj).
                 super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        piVar9 = (this->x).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start;
        piVar10 = (this->out).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_start;
        iVar19 = 1;
        lVar21 = 0;
        do {
          iVar2 = piVar5[lVar21];
          iVar3 = this->n;
          if (iVar2 < iVar3) {
            iVar4 = (this->used).uid;
            lVar20 = (long)piVar10[iVar2] + (long)iVar3;
            iVar3 = piVar7[lVar20];
            piVar7[lVar20] = iVar4;
            if (iVar3 != iVar4) {
              lVar20 = (long)iVar19;
              iVar19 = iVar19 + 1;
              piVar5[lVar20] = piVar10[iVar2] + this->n;
            }
          }
          else {
            piVar13 = *(pointer *)
                       ((long)&pvVar8[iVar2 - iVar3].super__Vector_base<int,_std::allocator<int>_>.
                               _M_impl.super__Vector_impl_data + 8);
            for (piVar17 = pvVar8[iVar2 - iVar3].super__Vector_base<int,_std::allocator<int>_>.
                           _M_impl.super__Vector_impl_data._M_start; piVar17 != piVar13;
                piVar17 = piVar17 + 1) {
              iVar2 = *piVar17;
              if ((piVar9[iVar2] < 0) &&
                 (iVar3 = (this->used).uid, iVar4 = piVar7[iVar2], piVar7[iVar2] = iVar3,
                 iVar4 != iVar3)) {
                lVar20 = (long)iVar19;
                iVar19 = iVar19 + 1;
                piVar5[lVar20] = iVar2;
              }
            }
          }
          lVar21 = lVar21 + 1;
        } while (lVar21 < iVar19);
      }
      bVar14 = 1 < (long)uVar15;
      uVar15 = uVar15 - 1;
    } while (bVar14);
  }
  if (((2 < debug) && (this->depth <= this->maxDepth)) && (iVar1 != this->rn)) {
    lpReduction();
  }
  return iVar1 != this->rn;
}

Assistant:

bool branch_and_reduce_algorithm::lpReduction()
{
    int oldn = rn;
    updateLP();

#if 1
    for (int v = 0; v < n; v++)
    {
        if (x[v] < 0 && used.get(v) && !used.get(n + v))
            set(v, 0);
    }
    used.clear();
    int p = 0;
    iter.assign(iter.size(), 0);
    for (int s = 0; s < n; s++)
        if (x[s] < 0 && used.add(s))
        {
            int qt = 0;
            que[qt] = s;
            while (qt >= 0)
            {
                int v = que[qt], u = -1;
                if (v < n)
                {
                    while (iter[v] < static_cast<int>(adj[v].size()))
                    {
                        u = n + adj[v][iter[v]++];
                        if (x[u - n] < 0 && used.add(u))
                        {
                            break;
                        }
                        u = -1;
                    }
                }
                else if (used.add(in[v - n]))
                {
                    u = in[v - n];
                }
                if (u >= 0)
                {
                    que[++qt] = u;
                }
                else
                {
                    level[p++] = v;
                    qt--;
                }
            }
        }
    used.clear();
    for (int i = p - 1; i >= 0; i--)
        if (used.add(level[i]))
        {
            int v = level[i];
            int qs = 0, qt = 0;
            que[qt++] = v;
            bool ok = true;
            while (qs < qt)
            {
                v = que[qs++];
                if (used.get(v >= n ? (v - n) : (v + n)))
                    ok = false;
                if (v >= n)
                {
                    for (int u : adj[v - n])
                        if (x[u] < 0 && used.add(u))
                        {
                            que[qt++] = u;
                        }
                }
                else if (used.add(n + out[v]))
                {
                    que[qt++] = n + out[v];
                }
            }
            ok = false;
            if (ok)
            {
                for (int j = 0; j < qt; j++)
                {
                    v = que[j];
                    if (v >= n)
                        set(v - n, 0);
                }
            }
        }

#endif // 0
    if (debug >= 3 && depth <= maxDepth && oldn != rn)
        fprintf(stderr, "%sLP: %d -> %d\n", debugString().c_str(), oldn, rn);
    return oldn != rn;
}